

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

pair<std::byte_*,_unsigned_long> __thiscall
BufferedFile::AdvanceStream(BufferedFile *this,size_t length)

{
  unsigned_long uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  pair<std::byte_*,_unsigned_long> pVar7;
  initializer_list<unsigned_long> __l;
  size_t local_38;
  long local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = this->nSrcPos;
  uVar3 = this->m_read_pos;
  if (uVar5 < uVar3) {
    __assert_fail("m_read_pos <= nSrcPos",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/streams.h"
                  ,0x1f7,"std::pair<std::byte *, size_t> BufferedFile::AdvanceStream(size_t)");
  }
  if (this->nReadLimit < uVar3 + length) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    local_30 = std::iostream_category();
    local_38 = CONCAT44(local_38._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar2,(error_code *)"Attempt to position past buffer limit");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if (length != 0 && uVar3 == uVar5) {
      Fill(this);
      uVar5 = this->nSrcPos;
      uVar3 = this->m_read_pos;
    }
    uVar6 = (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar4 = uVar3 % uVar6;
    local_30 = uVar6 - uVar4;
    local_28 = uVar5 - uVar3;
    __l._M_len = 3;
    __l._M_array = &local_38;
    local_38 = length;
    uVar1 = std::min<unsigned_long>(__l);
    this->m_read_pos = this->m_read_pos + uVar1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      pVar7.second = uVar1;
      pVar7.first = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                    .super__Vector_impl_data._M_start + uVar4;
      return pVar7;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::pair<std::byte*, size_t> AdvanceStream(size_t length)
    {
        assert(m_read_pos <= nSrcPos);
        if (m_read_pos + length > nReadLimit) {
            throw std::ios_base::failure("Attempt to position past buffer limit");
        }
        // If there are no bytes available, read from the file.
        if (m_read_pos == nSrcPos && length > 0) Fill();

        size_t buffer_offset{static_cast<size_t>(m_read_pos % vchBuf.size())};
        size_t buffer_available{static_cast<size_t>(vchBuf.size() - buffer_offset)};
        size_t bytes_until_source_pos{static_cast<size_t>(nSrcPos - m_read_pos)};
        size_t advance{std::min({length, buffer_available, bytes_until_source_pos})};
        m_read_pos += advance;
        return std::make_pair(&vchBuf[buffer_offset], advance);
    }